

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seismogram.cpp
# Opt level: O1

void __thiscall
CombinedSeismogramm<float,_2>::Load
          (CombinedSeismogramm<float,_2> *this,SeismoType type,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *paths)

{
  vector<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_> *pvVar1;
  pointer pcVar2;
  pointer pSVar3;
  float *pfVar4;
  long lVar5;
  double dVar6;
  CombinedSeismogramm<float,_2> *pCVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar8;
  int iVar9;
  uint uVar10;
  pointer pbVar11;
  ostream *poVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  size_type sVar16;
  uint uVar17;
  long lVar18;
  size_type sVar19;
  long lVar20;
  undefined2 uVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  pointer pSVar25;
  float fVar26;
  float fVar27;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  line;
  string filename;
  vector<float,_std::allocator<float>_> rec_y;
  vector<float,_std::allocator<float>_> rec_x;
  string filename_source;
  string filename_rec;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v_1;
  ifstream ifs_source;
  ifstream ifs_rec;
  ifstream ifs;
  ifstream ifs0;
  float local_9bc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_9b8;
  long *local_9a0;
  long local_998;
  long local_990 [2];
  ulong local_980;
  float local_974;
  ulong local_970;
  ulong local_968;
  CombinedSeismogramm<float,_2> *local_960;
  ulong local_958;
  ulong local_950;
  vector<float,_std::allocator<float>_> local_948;
  vector<float,_std::allocator<float>_> local_928;
  ulong local_910;
  size_type local_908;
  vector<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_> *local_900;
  long *local_8f8 [2];
  long local_8e8 [2];
  long local_8d8;
  ulong local_8d0;
  long *local_8c8 [2];
  long local_8b8 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_8a8;
  long local_8a0;
  ulong local_898;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_890;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_878;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_860;
  byte abStack_840 [488];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_658;
  byte abStack_638 [496];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_448 [22];
  long local_238 [4];
  byte abStack_218 [488];
  
  pvVar1 = &this->seismogramms;
  std::vector<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>::resize
            (pvVar1,((long)(this->componentInfos).
                           super__Vector_base<CombinedSeismogramm<float,_2>::ComponentInfo,_std::allocator<CombinedSeismogramm<float,_2>::ComponentInfo>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->componentInfos).
                           super__Vector_base<CombinedSeismogramm<float,_2>::ComponentInfo,_std::allocator<CombinedSeismogramm<float,_2>::ComponentInfo>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333);
  if (type == CSV) {
    local_900 = pvVar1;
    std::vector<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>::resize
              (pvVar1,(long)(paths->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(paths->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 4);
    pbVar11 = (paths->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((paths->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish != pbVar11) {
      uVar13 = 0;
      local_910 = 0;
      local_960 = this;
      local_8a8 = paths;
      do {
        local_9a0 = local_990;
        lVar18 = local_910 * 0x20;
        pcVar2 = pbVar11[local_910]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_9a0,pcVar2,pcVar2 + pbVar11[local_910]._M_string_length);
        std::__cxx11::string::append((char *)&local_9a0);
        std::ifstream::ifstream(local_238);
        std::ifstream::open((char *)local_238,(_Ios_Openmode)local_9a0);
        if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) goto LAB_001085b3;
        local_8a0 = lVar18;
        getNextLineAndSplitIntoTokens_abi_cxx11_(&local_9b8,(istream *)local_238,';');
        uVar15 = (uint)((long)local_9b8.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_9b8.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5);
        uVar17 = uVar15 - 1;
        iVar9 = std::__cxx11::string::compare
                          ((char *)(local_9b8.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + -1));
        uVar10 = uVar17;
        if (iVar9 != 0) {
          uVar10 = uVar15;
        }
        local_958 = (ulong)uVar10;
        local_980 = 0xffffffff;
        local_968 = (ulong)uVar17;
        if (local_958 <=
            (ulong)((long)local_9b8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_9b8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5)) {
          local_980 = 0xffffffff;
          do {
            getNextLineAndSplitIntoTokens_abi_cxx11_(&local_658,(istream *)local_238,';');
            local_448[0].
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 local_9b8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_448[0].
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_9b8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_448[0].
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 local_9b8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_9b8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 local_658.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_9b8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_658.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_9b8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 local_658.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_658.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_658.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_658.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(local_448);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_658);
            local_980 = (ulong)((int)local_980 + 1);
          } while (local_958 <=
                   (ulong)((long)local_9b8.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_9b8.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5));
        }
        std::ifstream::close();
        std::ifstream::ifstream((istream *)local_448);
        std::ifstream::open((char *)local_448,(_Ios_Openmode)local_9a0);
        getNextLineAndSplitIntoTokens_abi_cxx11_(&local_878,(istream *)local_448,';');
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_878);
        getNextLineAndSplitIntoTokens_abi_cxx11_(&local_860,(istream *)local_448,';');
        local_658.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_9b8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_658.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_9b8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_658.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_9b8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        sVar19 = uVar13 * 0x1c0;
        local_970 = local_968 >> 1 & 0x7fffffff;
        local_9b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_860.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_9b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_860.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_9b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_860.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_860.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_860.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_860.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_8d0 = uVar13;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_658);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_860);
        lVar18 = 0;
        sVar16 = sVar19;
        do {
          pSVar3 = (this->seismogramms).
                   super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar13 = ((long)(this->seismogramms).
                          super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar3 >> 6) *
                   0x6db6db6db6db6db7;
          if (uVar13 < local_8d0 + lVar18 || uVar13 - (local_8d0 + lVar18) == 0) goto LAB_00108592;
          std::
          vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          ::resize((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    *)((long)(pSVar3->header_data).other + sVar16 + 0xffffffffffffffce),
                   ((long)local_9b8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_9b8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U >> 1);
          lVar18 = lVar18 + 1;
          sVar16 = sVar16 + 0x1c0;
        } while (lVar18 == 1);
        uVar13 = local_980 & 0xffffffff;
        local_908 = sVar19;
        if (1 < (uint)local_968) {
          iVar9 = (int)local_970;
          uVar24 = 0;
          do {
            uVar22 = 0;
            sVar16 = local_908;
            do {
              pSVar3 = (local_960->seismogramms).
                       super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              uVar14 = ((long)(local_960->seismogramms).
                              super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar3 >> 6) *
                       0x6db6db6db6db6db7;
              if (uVar14 < local_8d0 + uVar22 || uVar14 - (local_8d0 + uVar22) == 0) {
                std::__throw_out_of_range_fmt
                          (
                          "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                          );
                uVar13 = local_950;
                goto LAB_0010857c;
              }
              std::vector<float,_std::allocator<float>_>::resize
                        ((vector<float,_std::allocator<float>_> *)
                         (uVar24 * 0x18 +
                         *(long *)((long)(pSVar3->header_data).other + sVar16 + 0xffffffffffffffce))
                         ,uVar13);
              uVar22 = uVar22 + 1;
              sVar16 = sVar16 + 0x1c0;
            } while (uVar22 == 1);
            uVar24 = uVar24 + 1;
          } while (uVar24 != iVar9 + (uint)(iVar9 == 0));
        }
        std::vector<float,_std::allocator<float>_>::resize(&local_960->times,uVar13);
        if (local_958 <=
            (ulong)((long)local_9b8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_9b8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5)) {
          local_898 = (ulong)(uint)((int)local_910 * 2);
          local_950 = (ulong)((int)local_910 * 2 + 1);
          local_8d8 = (ulong)((int)local_970 + (uint)((int)local_970 == 0)) * 0x18;
          uVar15 = 0;
          do {
            pbVar11 = local_9b8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            dVar6 = atof(((local_9b8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
            uVar24 = (ulong)uVar15;
            (local_960->times).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[uVar24] = (float)dVar6;
            if (1 < (uint)local_968) {
              pSVar3 = (local_960->seismogramms).
                       super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              uVar22 = ((long)(local_960->seismogramms).
                              super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar3 >> 6) *
                       0x6db6db6db6db6db7;
              uVar13 = local_898;
              if (uVar22 < local_898 || uVar22 - local_898 == 0) goto LAB_0010857c;
              pSVar25 = pSVar3 + local_950;
              lVar18 = *(long *)&pSVar3[local_898].data.
                                 super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                 ._M_impl;
              lVar20 = 0;
              do {
                dVar6 = atof(pbVar11[1]._M_dataplus._M_p);
                *(float *)(*(long *)(lVar18 + lVar20) + uVar24 * 4) = (float)dVar6;
                uVar13 = local_950;
                if (uVar22 < local_950 || uVar22 - local_950 == 0) goto LAB_0010857c;
                dVar6 = atof(pbVar11[2]._M_dataplus._M_p);
                *(float *)(*(long *)(*(long *)&(pSVar25->data).
                                               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                               ._M_impl + lVar20) + uVar24 * 4) = (float)dVar6;
                lVar20 = lVar20 + 0x18;
                pbVar11 = pbVar11 + 2;
              } while (local_8d8 != lVar20);
            }
            getNextLineAndSplitIntoTokens_abi_cxx11_(&local_860,(istream *)local_448,';');
            local_658.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 local_9b8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_658.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_9b8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_658.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 local_9b8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_9b8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 local_860.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_9b8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_860.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_9b8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 local_860.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_860.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_860.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_860.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_658);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_860);
            uVar15 = uVar15 + 1;
          } while (local_958 <=
                   (ulong)((long)local_9b8.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_9b8.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5));
        }
        pCVar7 = local_960;
        uVar13 = (ulong)((int)local_980 - 1);
        pfVar4 = (local_960->times).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        interpolate_data_on_equal_time_intervals
                  (local_960,
                   ((pfVar4[uVar13] - *pfVar4) / (float)uVar13) *
                   local_960->interpolation_multiplier);
        pfVar4 = (pCVar7->times).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar15 = (uint)(*(int *)&(pCVar7->times).super__Vector_base<float,_std::allocator<float>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - (int)pfVar4) >> 2;
        dVar6 = floor((double)(pfVar4[1] - *pfVar4) * 1000000.0 + 0.5);
        pvVar1 = local_900;
        sVar16 = local_908;
        uVar13 = local_970;
        lVar18 = 0x32;
        do {
          pSVar3 = (pvVar1->
                   super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          *(undefined8 *)((long)(pSVar3->header_data).other + lVar18 + sVar16 + 0xffffffffffffffb4)
               = 0x100000001;
          *(undefined4 *)((long)(pSVar3->header_data).other + lVar18 + sVar16 + 0xffffffffffffffbc)
               = 1;
          *(short *)((long)(pSVar3->header_data).other + lVar18 + sVar16 + 0xffffffffffffffc0) =
               (short)uVar13;
          *(undefined2 *)((long)(pSVar3->header_data).other + lVar18 + sVar16 + 0xffffffffffffffc2)
               = 0;
          uVar21 = (undefined2)(long)dVar6;
          *(undefined2 *)((long)(pSVar3->header_data).other + lVar18 + sVar16 + 0xffffffffffffffc4)
               = uVar21;
          *(undefined2 *)((long)(pSVar3->header_data).other + lVar18 + sVar16 + 0xffffffffffffffc6)
               = uVar21;
          uVar21 = (undefined2)uVar15;
          *(undefined2 *)((long)(pSVar3->header_data).other + lVar18 + sVar16 + 0xffffffffffffffc8)
               = uVar21;
          *(undefined2 *)((long)(pSVar3->header_data).other + lVar18 + sVar16 + 0xffffffffffffffca)
               = uVar21;
          *(undefined2 *)((long)(pSVar3->header_data).other + lVar18 + sVar16 + 0xffffffffffffffcc)
               = 5;
          memset((void *)((long)(pSVar3->header_data).other + lVar18 + sVar16 + 0xffffffffffffffce),
                 0,0x176);
          lVar20 = local_8a0;
          pvVar8 = local_8a8;
          lVar18 = lVar18 + 0x1c0;
        } while (lVar18 == 0x1f2);
        local_950 = CONCAT44(local_950._4_4_,uVar15);
        pbVar11 = (local_8a8->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        local_8c8[0] = local_8b8;
        lVar18 = *(long *)((long)&(pbVar11->_M_dataplus)._M_p + local_8a0);
        local_8d8 = (long)dVar6;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_8c8,lVar18,
                   *(long *)((long)&pbVar11->_M_string_length + local_8a0) + lVar18);
        std::__cxx11::string::append((char *)local_8c8);
        std::ifstream::ifstream((istream *)&local_658);
        std::ifstream::open((char *)&local_658,(_Ios_Openmode)local_8c8[0]);
        local_928.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_928.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = (float *)0x0;
        local_928.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (float *)0x0;
        local_948.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (float *)0x0;
        local_948.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_948.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = (float *)0x0;
        if ((abStack_638
             [local_658.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length] & 5) == 0) {
          if (1 < (uint)local_968) {
            iVar9 = (int)local_970 + (uint)((int)local_970 == 0);
            do {
              getNextLineAndSplitIntoTokens_abi_cxx11_(&local_860,(istream *)&local_658,';');
              if ((ulong)((long)local_860.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_860.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Error while reading receivers data",0x22);
                std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
                std::ostream::put('@');
                std::ostream::flush();
              }
              else {
                dVar6 = atof(((local_860.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
                local_8f8[0] = (long *)CONCAT44(local_8f8[0]._4_4_,(float)dVar6);
                if (local_928.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    local_928.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                            (&local_928,
                             (iterator)
                             local_928.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_finish,(float *)local_8f8);
                }
                else {
                  *local_928.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish = (float)dVar6;
                  local_928.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_928.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                }
                if ((ulong)((long)local_860.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_860.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 5) < 2)
                goto LAB_001085a0;
                dVar6 = atof(local_860.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
                local_8f8[0] = (long *)CONCAT44(local_8f8[0]._4_4_,(float)dVar6);
                if (local_948.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    local_948.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                            (&local_948,
                             (iterator)
                             local_948.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_finish,(float *)local_8f8);
                }
                else {
                  *local_948.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish = (float)dVar6;
                  local_948.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_948.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                }
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_860);
              iVar9 = iVar9 + -1;
            } while (iVar9 != 0);
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Warning: no csv receivers data found",0x24);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
          std::ostream::put('@');
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "         All receivers positions have been set to (0.0, 0.0)",0x3c);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
          std::ostream::put('@');
          std::ostream::flush();
          if (1 < (uint)local_968) {
            iVar9 = (int)local_970 + (uint)((int)local_970 == 0);
            do {
              local_860.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)((ulong)local_860.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
              if (local_928.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_928.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                          (&local_928,
                           (iterator)
                           local_928.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish,(float *)&local_860);
              }
              else {
                *local_928.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish = 0.0;
                local_928.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_928.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              local_860.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)((ulong)local_860.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
              if (local_948.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_948.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                          (&local_948,
                           (iterator)
                           local_948.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish,(float *)&local_860);
              }
              else {
                *local_948.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish = 0.0;
                local_948.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_948.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              iVar9 = iVar9 + -1;
            } while (iVar9 != 0);
          }
        }
        pbVar11 = (pvVar8->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        local_8f8[0] = local_8e8;
        lVar18 = *(long *)((long)&(pbVar11->_M_dataplus)._M_p + lVar20);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_8f8,lVar18,
                   *(long *)((long)&pbVar11->_M_string_length + lVar20) + lVar18);
        std::__cxx11::string::append((char *)local_8f8);
        uVar13 = local_970;
        std::ifstream::ifstream((istream *)&local_860);
        std::ifstream::open((char *)&local_860,(_Ios_Openmode)local_8f8[0]);
        if ((abStack_840
             [local_860.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length] & 5) == 0) {
          getNextLineAndSplitIntoTokens_abi_cxx11_(&local_890,(istream *)&local_860,';');
          pbVar11 = local_890.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)local_890.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_890.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Error while reading source data",0x1f);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
            std::ostream::put('@');
            std::ostream::flush();
          }
          else {
            dVar6 = atof(((local_890.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
            local_9bc = (float)dVar6;
            dVar6 = atof(pbVar11[1]._M_dataplus._M_p);
            local_974 = (float)dVar6;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_890);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Warning: no csv source data found",0x21);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
          std::ostream::put('@');
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"         Source position has been set to (0.0, 0.0)",
                     0x33);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
          std::ostream::put('@');
          std::ostream::flush();
          local_9bc = 0.0;
          local_974 = 0.0;
        }
        local_958 = (ulong)(uint)((int)local_910 * 2);
        iVar9 = (int)uVar13;
        local_908 = uVar13 & 0xffffffff;
        lVar18 = (long)local_974;
        uVar13 = 0;
        do {
          lVar20 = local_958 + uVar13;
          std::vector<segy_trace_header,_std::allocator<segy_trace_header>_>::resize
                    (&(local_900->
                      super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>).
                      _M_impl.super__Vector_impl_data._M_start[lVar20].trace_header_data,local_908);
          local_980 = uVar13;
          if (1 < (uint)local_968) {
            lVar23 = 0x1d;
            uVar13 = 0;
            do {
              lVar5 = *(long *)&(local_900->
                                super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[lVar20].trace_header_data
                                .
                                super__Vector_base<segy_trace_header,_std::allocator<segy_trace_header>_>
                                ._M_impl;
              *(int *)(lVar5 + -0x74 + lVar23 * 4) = (int)uVar13;
              *(int *)(lVar5 + -0x70 + lVar23 * 4) = (int)uVar13;
              *(short *)(lVar5 + -0x58 + lVar23 * 4) = (short)uVar13;
              fVar26 = local_928.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar13];
              *(int *)(lVar5 + -0x24 + lVar23 * 4) = (int)(long)fVar26;
              fVar27 = local_948.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar13];
              *(int *)(lVar5 + -0x20 + lVar23 * 4) = (int)(long)fVar27;
              *(int *)(lVar5 + -0x2c + lVar23 * 4) = (int)(long)local_9bc;
              *(int *)(lVar5 + -0x28 + lVar23 * 4) = (int)lVar18;
              *(undefined8 *)(lVar5 + -0x6c + lVar23 * 4) = 0x100000001;
              *(short *)(lVar5 + -2 + lVar23 * 4) = (short)local_950;
              *(short *)(lVar5 + lVar23 * 4) = (short)local_8d8;
              *(undefined2 *)(lVar5 + -0x1c + lVar23 * 4) = 1;
              fVar26 = fVar26 - local_9bc;
              fVar27 = fVar27 - local_974;
              dVar6 = (double)(fVar26 * fVar26 + fVar27 * fVar27) + 0.5;
              if (dVar6 < 0.0) {
                dVar6 = sqrt(dVar6);
              }
              else {
                dVar6 = SQRT(dVar6);
              }
              *(int *)(*(long *)&(local_900->
                                 super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start[lVar20].
                                 trace_header_data.
                                 super__Vector_base<segy_trace_header,_std::allocator<segy_trace_header>_>
                                 ._M_impl + -0x50 + lVar23 * 4) = (int)(long)dVar6;
              uVar13 = uVar13 + 1;
              lVar23 = lVar23 + 0x3c;
            } while (iVar9 + (uint)(iVar9 == 0) != uVar13);
          }
          uVar13 = local_980 + 1;
        } while (local_980 == 0);
        std::ifstream::~ifstream(&local_860);
        if (local_8f8[0] != local_8e8) {
          operator_delete(local_8f8[0],local_8e8[0] + 1);
        }
        pvVar8 = local_8a8;
        this = local_960;
        if (local_948.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_948.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_948.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_948.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_928.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_928.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_928.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_928.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        std::ifstream::~ifstream(&local_658);
        if (local_8c8[0] != local_8b8) {
          operator_delete(local_8c8[0],local_8b8[0] + 1);
        }
        std::ifstream::~ifstream(local_448);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_9b8);
        std::ifstream::~ifstream(local_238);
        if (local_9a0 != local_990) {
          operator_delete(local_9a0,local_990[0] + 1);
        }
        local_910 = (ulong)((int)local_910 + 1);
        pbVar11 = (pvVar8->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        uVar13 = (ulong)((int)local_8d0 + 2);
      } while (local_910 <
               (ulong)((long)(pvVar8->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 >> 5));
    }
  }
  else if ((type == SEG_Y) &&
          (pbVar11 = (paths->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,
          (paths->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish != pbVar11)) {
    uVar15 = 1;
    uVar13 = 0;
    do {
      Seismogramm<float>::LoadSegY
                ((this->seismogramms).
                 super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_start + uVar13,pbVar11 + uVar13,&this->times);
      uVar13 = (ulong)uVar15;
      pbVar11 = (paths->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar15 = uVar15 + 1;
    } while (uVar13 < (ulong)((long)(paths->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 >> 5
                             ));
  }
  return;
LAB_0010857c:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar13,
             uVar22);
LAB_00108592:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_001085a0:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",1);
LAB_001085b3:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Error in reading CSV file.",0x1a);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"There is no such file: ",0x17);
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,(char *)local_9a0,local_998);
  std::endl<char,std::char_traits<char>>(poVar12);
  exit(1);
}

Assistant:

void CombinedSeismogramm<Scalar, dims>::Load(SeismoType type, std::vector<std::string> paths)
{
    seismogramms.resize(componentInfos.size());
    if (type == SEG_Y)
    {
        for (IndexType p = 0; p < paths.size(); ++p)
        {
            seismogramms[p].LoadSegY(paths[p], times);
        }
    }
    else if (type == CSV)
    {
        seismogramms.resize(paths.size() * dims);
        for (IndexType path_index = 0; path_index < paths.size(); path_index++)
        {
            // Calculating number of time steps and number of traces
            // ///////////////////////////////////////
            std::string filename = paths[path_index] + ".csv";
            IndexType num_of_times = -1;
            IndexType num_of_all_traces = 0;
            IndexType num_of_receivers;
            std::ifstream ifs0;
            ifs0.open(filename.c_str());
            if (!ifs0)
            {
                std::cout << "Error in reading CSV file." << std::endl;
                std::cout << "There is no such file: " << filename << std::endl;
                std::exit(1);
            }
            std::vector<std::string> line = getNextLineAndSplitIntoTokens(ifs0);
            num_of_all_traces = line.size() - 1;
            num_of_receivers = num_of_all_traces / dims;
            if (line.back() == "\r") num_of_all_traces -= 1;
            while (line.size() >= num_of_all_traces + 1)
            {
                line = getNextLineAndSplitIntoTokens(ifs0);
                num_of_times++;
            }
            ifs0.close();

            // Reading  data
            // ///////////////////////////////////////
            std::ifstream ifs;
            ifs.open(filename.c_str());
            getNextLineAndSplitIntoTokens(ifs);

            line = getNextLineAndSplitIntoTokens(ifs);

            for (int k = 0; k < dims; k++)
                seismogramms.at(dims * path_index + k).data.resize((line.size()-1)/dims);

            for (int trace_i = 0; trace_i < num_of_receivers; trace_i++)
            {
                for (int k = 0; k < dims; k++)
                    seismogramms.at(dims * path_index + k).data[trace_i].resize(num_of_times);
            }
            times.resize(num_of_times);

            IndexType time_i = 0;
            while (line.size() >= num_of_all_traces + 1)
            {
                times[time_i] = ::atof(line[0].c_str());
                for (int trace_i = 0; trace_i < num_of_receivers; trace_i++)
                {
                    seismogramms.at(dims * path_index + 0).data[trace_i][time_i] = ::atof(line[1 + trace_i * dims].c_str());
                    seismogramms.at(dims * path_index + 1).data[trace_i][time_i] = ::atof(line[2 + trace_i * dims].c_str());
                    if (dims >= 3)
                        seismogramms.at(dims * path_index + 2).data[trace_i][time_i] = ::atof(line[3 + trace_i * dims].c_str());
                }
                line = getNextLineAndSplitIntoTokens(ifs);
                time_i++;
            }

            // Interpolating results on eqidistant time grid
            // ///////////////////////////////////////

            Scalar interval = (times[num_of_times-1] - times[0]) / (num_of_times - 1);
            interpolate_data_on_equal_time_intervals(interval * interpolation_multiplier);
            num_of_times = times.size();
            interval = times[1] - times[0];


            // Set binary header data
            // ///////////////////////////////////////
            struct segy_bin_header_data header_data;
            header_data.sample_interval = (uint32)(floor(interval * 1000000.0 + 0.5));
            header_data.sample_interval_reel = header_data.sample_interval;


            header_data.job_id = 1;
            header_data.line_num = 1;
            header_data.reel_num = 1;
            header_data.num_of_traces_per_record = num_of_receivers;
            header_data.num_of_auxiliary_traces_per_record = 0;
            header_data.data_sample_format = 5;
            header_data.reel_num = 1;
            header_data.samples_per_trace = num_of_times;
            header_data.samples_per_trace_reel = header_data.samples_per_trace;
            for (int i = 0; i < 17; i++)
                header_data.other[i] = 0;
            for (int i = 0; i < 170; i++)
                header_data.reserve[i] = 0;

            for (IndexType k = 0; k < dims; k++)
            {
                seismogramms[dims*path_index + k].header_data = header_data;
            }



            // Set trace header data
            // ///////////////////////////////////////

            // Reading receivers data
            std::string filename_rec = paths[path_index] + ".receivers.csv";
            std::ifstream ifs_rec;
            ifs_rec.open(filename_rec.c_str());
            std::vector<Scalar> rec_x;
            std::vector<Scalar> rec_y;
            if (ifs_rec)
            {
                for (IndexType i = 0; i < num_of_receivers; i++)
                {
                    std::vector<std::string> v = getNextLineAndSplitIntoTokens(ifs_rec);
                    if (v.size() < 2)
                    {
                        std::cout << "Error while reading receivers data" << std::endl;
                    }
                    else
                    {
                        rec_x.push_back(::atof(v.at(0).c_str()));
                        rec_y.push_back(::atof(v.at(1).c_str()));
                    }
                }
            }
            else
            {
                std::cout << "Warning: no csv receivers data found" << std::endl;
                std::cout << "         All receivers positions have been set to (0.0, 0.0)" << std::endl;
                for (IndexType i = 0; i < num_of_receivers; i++)
                {
                    rec_x.push_back(0.0);
                    rec_y.push_back(0.0);
                }
            }

            // Reading source data
            std::string filename_source = paths[path_index] + ".source.csv";
            std::ifstream ifs_source;
            ifs_source.open(filename_source.c_str());
            Scalar source_x;
            Scalar source_y;
            if (ifs_source)
            {
                std::vector<std::string> v = getNextLineAndSplitIntoTokens(ifs_source);
                if (v.size() < 2)
                {
                    std::cout << "Error while reading source data" << std::endl;
                }
                else
                {
                    source_x = ::atof(v.at(0).c_str());
                    source_y = ::atof(v.at(1).c_str());
                }
            }
            else
            {
                std::cout << "Warning: no csv source data found" << std::endl;
                std::cout << "         Source position has been set to (0.0, 0.0)" << std::endl;
                source_x = 0.0;
                source_y = 0.0;
            }

            // Setting trace headers data

            for (IndexType k = 0; k < dims; k++)
            {
                seismogramms[dims*path_index + k].trace_header_data.resize(num_of_receivers);
                for (int i = 0; i < num_of_receivers; i++)
                {
                    seismogramms[dims*path_index + k].trace_header_data[i].trace_seq_num_line = i;
                    seismogramms[dims*path_index + k].trace_header_data[i].trace_seq_num_reel = i;
                    seismogramms[dims*path_index + k].trace_header_data[i].trace_id_code = i;
                    seismogramms[dims*path_index + k].trace_header_data[i].receiver_x = rec_x[i];
                    seismogramms[dims*path_index + k].trace_header_data[i].receiver_y = rec_y[i];
                    seismogramms[dims*path_index + k].trace_header_data[i].source_x = source_x;
                    seismogramms[dims*path_index + k].trace_header_data[i].source_y = source_y;
                    seismogramms[dims*path_index + k].trace_header_data[i].field_record_num = 1;
                    seismogramms[dims*path_index + k].trace_header_data[i].num_of_samples = header_data.samples_per_trace;
                    seismogramms[dims*path_index + k].trace_header_data[i].sample_interval = header_data.sample_interval;
                    seismogramms[dims*path_index + k].trace_header_data[i].trace_num_reel = 1;
                    seismogramms[dims*path_index + k].trace_header_data[i].units_id = 1;
                    seismogramms[dims*path_index + k].trace_header_data[i].distance_from_source =
                            uint32(sqrt(Scalar((rec_x[i]-source_x)*(rec_x[i]-source_x) + (rec_y[i]-source_y)*(rec_y[i]-source_y)) + 0.5));
                }
            }


        }
    }
}